

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_hotplugging.c
# Opt level: O3

void draw(ALLEGRO_JOYSTICK *curr_joy)

{
  int iVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  undefined4 uVar5;
  float in_XMM1_Da;
  undefined4 uVar6;
  float fVar7;
  ALLEGRO_JOYSTICK_STATE joystate;
  undefined1 local_168 [4];
  float local_164 [47];
  int aiStack_a8 [32];
  
  al_map_rgb(0,0,0);
  al_clear_to_color();
  if (curr_joy != (ALLEGRO_JOYSTICK *)0x0) {
    al_get_joystick_state(curr_joy,local_168);
    iVar1 = al_get_joystick_num_sticks(curr_joy);
    if (0 < iVar1) {
      iVar1 = 0;
      pfVar4 = local_164;
      lVar3 = 0;
      do {
        fVar7 = pfVar4[-1];
        uVar6 = 0x42c80000;
        in_XMM1_Da = *pfVar4 * 20.0 + 100.0;
        uVar5 = al_map_rgb(0xff,0xff,0xff);
        al_draw_filled_circle((float)iVar1 + fVar7 * 20.0 + 100.0,in_XMM1_Da,0x41a00000,uVar5,uVar6)
        ;
        lVar3 = lVar3 + 1;
        iVar2 = al_get_joystick_num_sticks(curr_joy);
        iVar1 = iVar1 + 0x50;
        pfVar4 = pfVar4 + 3;
      } while (lVar3 < iVar2);
    }
    iVar1 = al_get_joystick_num_buttons(curr_joy);
    if (0 < iVar1) {
      iVar1 = 10;
      lVar3 = 0;
      do {
        if (aiStack_a8[lVar3] != 0) {
          uVar5 = al_map_rgb(0xff,0xff,0xff);
          fVar7 = 400.0;
          al_draw_filled_circle((float)iVar1,0x43c80000,0x41100000,uVar5,in_XMM1_Da);
          in_XMM1_Da = fVar7;
        }
        lVar3 = lVar3 + 1;
        iVar2 = al_get_joystick_num_buttons(curr_joy);
        iVar1 = iVar1 + 0x14;
      } while (lVar3 < iVar2);
    }
  }
  al_flip_display();
  return;
}

Assistant:

static void draw(ALLEGRO_JOYSTICK *curr_joy)
{
   int x = 100;
   int y = 100;
   ALLEGRO_JOYSTICK_STATE joystate;
   int i;

   al_clear_to_color(al_map_rgb(0, 0, 0));

   if (curr_joy) {
      al_get_joystick_state(curr_joy, &joystate);
      for (i = 0; i < al_get_joystick_num_sticks(curr_joy); i++) {
         al_draw_filled_circle(
               x+joystate.stick[i].axis[0]*20 + i * 80,
               y+joystate.stick[i].axis[1]*20,
               20, al_map_rgb(255, 255, 255)
            );
      }
      for (i = 0; i < al_get_joystick_num_buttons(curr_joy); i++) {
         if (joystate.button[i]) {
            al_draw_filled_circle(
                  i*20+10, 400, 9, al_map_rgb(255, 255, 255)
                  );
         }
      }
   }

   al_flip_display();
}